

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMvMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  int iVar13;
  size_t sVar14;
  Geometry *pGVar15;
  RTCFilterFunctionN p_Var16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int iVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  AABBNodeMB4D *node1;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar30;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar31;
  long lVar33;
  uint uVar34;
  ulong uVar35;
  long lVar36;
  long lVar37;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar38;
  ulong uVar39;
  size_t sVar40;
  ulong uVar41;
  ulong uVar42;
  float fVar43;
  float fVar56;
  float fVar57;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar58;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar55;
  float fVar59;
  float fVar64;
  float fVar65;
  float fVar66;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar67;
  float fVar76;
  float fVar77;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar70;
  float fVar78;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar79;
  float fVar85;
  float fVar86;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar82;
  float fVar87;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar95;
  float fVar96;
  float fVar100;
  float fVar102;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar103;
  undefined1 auVar99 [16];
  float fVar104;
  float fVar106;
  float fVar107;
  float fVar108;
  undefined1 auVar105 [16];
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  uint uVar130;
  uint uVar131;
  uint uVar132;
  uint uVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  int iVar138;
  int iVar139;
  int iVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  vbool<4> valid;
  undefined1 local_11c8 [16];
  StackItemT<embree::NodeRefPtr<4>_> local_11b8;
  long local_11a0;
  long local_1198;
  StackItemT<embree::NodeRefPtr<4>_> *local_1190;
  Scene *local_1188;
  StackItemT<embree::NodeRefPtr<4>_> *local_1180;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  float local_10e8 [4];
  float local_10d8 [4];
  float local_10c8 [4];
  float local_10b8 [4];
  undefined1 local_10a8 [16];
  float local_1098 [4];
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  int local_1078;
  int iStack_1074;
  int iStack_1070;
  int iStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  HitK<4> h;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  ulong uVar32;
  float fVar101;
  
  pSVar38 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar118 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar101 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar116 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar119 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar43 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar56 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar39 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar42 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar35 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar27 = (tray->tnear).field_0.i[k];
  iVar138 = (tray->tfar).field_0.i[k];
  auVar72._4_4_ = iVar138;
  auVar72._0_4_ = iVar138;
  auVar72._8_4_ = iVar138;
  auVar72._12_4_ = iVar138;
  local_1180 = (StackItemT<embree::NodeRefPtr<4>_> *)
               (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_1018 = fVar118;
  fStack_1014 = fVar118;
  fStack_1010 = fVar118;
  fStack_100c = fVar118;
  local_1028 = fVar101;
  fStack_1024 = fVar101;
  fStack_1020 = fVar101;
  fStack_101c = fVar101;
  local_1038 = fVar116;
  fStack_1034 = fVar116;
  fStack_1030 = fVar116;
  fStack_102c = fVar116;
  local_1048 = fVar119;
  fStack_1044 = fVar119;
  fStack_1040 = fVar119;
  fStack_103c = fVar119;
  local_1058 = fVar43;
  fStack_1054 = fVar43;
  fStack_1050 = fVar43;
  fStack_104c = fVar43;
  local_1068 = fVar56;
  fStack_1064 = fVar56;
  fStack_1060 = fVar56;
  fStack_105c = fVar56;
  local_1078 = iVar27;
  iStack_1074 = iVar27;
  iStack_1070 = iVar27;
  iStack_106c = iVar27;
  pSVar31 = local_1180;
  fVar57 = fVar118;
  fVar58 = fVar118;
  fVar59 = fVar118;
  fVar64 = fVar101;
  fVar65 = fVar101;
  fVar66 = fVar101;
  fVar67 = fVar116;
  fVar76 = fVar116;
  fVar77 = fVar116;
  fVar78 = fVar119;
  fVar79 = fVar119;
  fVar85 = fVar119;
  fVar86 = fVar43;
  fVar87 = fVar43;
  fVar96 = fVar43;
  fVar100 = fVar56;
  fVar102 = fVar56;
  fVar103 = fVar56;
  iVar138 = iVar27;
  iVar139 = iVar27;
  iVar140 = iVar27;
LAB_006f6225:
  do {
    do {
      if (pSVar38 == stack) {
        return;
      }
      pSVar30 = pSVar38 + -1;
      pSVar38 = pSVar38 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) <= (float)pSVar30->dist &&
             (float)pSVar30->dist != *(float *)(ray + k * 4 + 0x80));
    sVar40 = (pSVar38->ptr).ptr;
    while ((sVar40 & 8) == 0) {
      pSVar30 = (StackItemT<embree::NodeRefPtr<4>_> *)(sVar40 & 0xfffffffffffffff0);
      fVar104 = *(float *)(ray + k * 4 + 0x70);
      pfVar5 = (float *)((long)&pSVar30[8].ptr.ptr + uVar39);
      pfVar4 = (float *)((long)&pSVar30[2].ptr.ptr + uVar39);
      auVar80._0_4_ = ((*pfVar5 * fVar104 + *pfVar4) - fVar118) * fVar119;
      auVar80._4_4_ = ((pfVar5[1] * fVar104 + pfVar4[1]) - fVar57) * fVar78;
      auVar80._8_4_ = ((pfVar5[2] * fVar104 + pfVar4[2]) - fVar58) * fVar79;
      auVar80._12_4_ = ((pfVar5[3] * fVar104 + pfVar4[3]) - fVar59) * fVar85;
      auVar68._4_4_ = iVar138;
      auVar68._0_4_ = iVar27;
      auVar68._8_4_ = iVar139;
      auVar68._12_4_ = iVar140;
      auVar68 = maxps(auVar68,auVar80);
      pfVar5 = (float *)((long)&pSVar30[8].ptr.ptr + uVar42);
      pfVar4 = (float *)((long)&pSVar30[2].ptr.ptr + uVar42);
      auVar93._0_4_ = ((*pfVar5 * fVar104 + *pfVar4) - fVar101) * fVar43;
      auVar93._4_4_ = ((pfVar5[1] * fVar104 + pfVar4[1]) - fVar64) * fVar86;
      auVar93._8_4_ = ((pfVar5[2] * fVar104 + pfVar4[2]) - fVar65) * fVar87;
      auVar93._12_4_ = ((pfVar5[3] * fVar104 + pfVar4[3]) - fVar66) * fVar96;
      pfVar5 = (float *)((long)&pSVar30[8].ptr.ptr + uVar35);
      pfVar4 = (float *)((long)&pSVar30[2].ptr.ptr + uVar35);
      auVar94._0_4_ = ((*pfVar5 * fVar104 + *pfVar4) - fVar116) * fVar56;
      auVar94._4_4_ = ((pfVar5[1] * fVar104 + pfVar4[1]) - fVar67) * fVar100;
      auVar94._8_4_ = ((pfVar5[2] * fVar104 + pfVar4[2]) - fVar76) * fVar102;
      auVar94._12_4_ = ((pfVar5[3] * fVar104 + pfVar4[3]) - fVar77) * fVar103;
      auVar80 = maxps(auVar93,auVar94);
      tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar68,auVar80);
      pfVar5 = (float *)((long)&pSVar30[8].ptr.ptr + (uVar39 ^ 0x10));
      pfVar4 = (float *)((long)&pSVar30[2].ptr.ptr + (uVar39 ^ 0x10));
      auVar98._0_4_ = ((*pfVar5 * fVar104 + *pfVar4) - fVar118) * fVar119;
      auVar98._4_4_ = ((pfVar5[1] * fVar104 + pfVar4[1]) - fVar57) * fVar78;
      auVar98._8_4_ = ((pfVar5[2] * fVar104 + pfVar4[2]) - fVar58) * fVar79;
      auVar98._12_4_ = ((pfVar5[3] * fVar104 + pfVar4[3]) - fVar59) * fVar85;
      auVar68 = minps(auVar72,auVar98);
      pfVar5 = (float *)((long)&pSVar30[8].ptr.ptr + (uVar42 ^ 0x10));
      pfVar4 = (float *)((long)&pSVar30[2].ptr.ptr + (uVar42 ^ 0x10));
      auVar88._0_4_ = ((*pfVar5 * fVar104 + *pfVar4) - fVar101) * fVar43;
      auVar88._4_4_ = ((pfVar5[1] * fVar104 + pfVar4[1]) - fVar64) * fVar86;
      auVar88._8_4_ = ((pfVar5[2] * fVar104 + pfVar4[2]) - fVar65) * fVar87;
      auVar88._12_4_ = ((pfVar5[3] * fVar104 + pfVar4[3]) - fVar66) * fVar96;
      pfVar5 = (float *)((long)&pSVar30[8].ptr.ptr + (uVar35 ^ 0x10));
      pfVar4 = (float *)((long)&pSVar30[2].ptr.ptr + (uVar35 ^ 0x10));
      auVar91._0_4_ = ((*pfVar5 * fVar104 + *pfVar4) - fVar116) * fVar56;
      auVar91._4_4_ = ((pfVar5[1] * fVar104 + pfVar4[1]) - fVar67) * fVar100;
      auVar91._8_4_ = ((pfVar5[2] * fVar104 + pfVar4[2]) - fVar76) * fVar102;
      auVar91._12_4_ = ((pfVar5[3] * fVar104 + pfVar4[3]) - fVar77) * fVar103;
      auVar80 = minps(auVar88,auVar91);
      auVar68 = minps(auVar68,auVar80);
      if (((uint)sVar40 & 7) == 6) {
        bVar21 = (fVar104 < *(float *)&pSVar30[0xf].ptr.ptr &&
                 *(float *)&pSVar30[0xe].ptr.ptr <= fVar104) && tNear.field_0._0_4_ <= auVar68._0_4_
        ;
        bVar22 = (fVar104 < *(float *)((long)&pSVar30[0xf].ptr.ptr + 4) &&
                 *(float *)((long)&pSVar30[0xe].ptr.ptr + 4) <= fVar104) &&
                 tNear.field_0._4_4_ <= auVar68._4_4_;
        bVar23 = (fVar104 < (float)pSVar30[0xf].dist && (float)pSVar30[0xe].dist <= fVar104) &&
                 tNear.field_0._8_4_ <= auVar68._8_4_;
        bVar24 = (fVar104 < *(float *)&pSVar30[0xf].field_0xc &&
                 *(float *)&pSVar30[0xe].field_0xc <= fVar104) &&
                 tNear.field_0._12_4_ <= auVar68._12_4_;
      }
      else {
        bVar21 = tNear.field_0._0_4_ <= auVar68._0_4_;
        bVar22 = tNear.field_0._4_4_ <= auVar68._4_4_;
        bVar23 = tNear.field_0._8_4_ <= auVar68._8_4_;
        bVar24 = tNear.field_0._12_4_ <= auVar68._12_4_;
      }
      auVar44._0_4_ = (uint)bVar21 * -0x80000000;
      auVar44._4_4_ = (uint)bVar22 * -0x80000000;
      auVar44._8_4_ = (uint)bVar23 * -0x80000000;
      auVar44._12_4_ = (uint)bVar24 * -0x80000000;
      uVar34 = movmskps((int)root.ptr,auVar44);
      root.ptr = (size_t)uVar34;
      pSVar31 = pSVar30;
      if (uVar34 == 0) goto LAB_006f6225;
      root.ptr = (size_t)(byte)uVar34;
      lVar36 = 0;
      if ((RayQueryContext *)root.ptr != (RayQueryContext *)0x0) {
        for (; ((byte)uVar34 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
        }
      }
      sVar40 = (&pSVar30->ptr)[lVar36].ptr;
      uVar34 = (uVar34 & 0xff) - 1 & uVar34 & 0xff;
      pSVar31 = pSVar38;
      if (uVar34 != 0) {
        uVar130 = tNear.field_0.i[lVar36];
        lVar36 = 0;
        if (uVar34 != 0) {
          for (; (uVar34 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
          }
        }
        sVar14 = (&pSVar30->ptr)[lVar36].ptr;
        uVar131 = tNear.field_0.i[lVar36];
        uVar34 = uVar34 - 1 & uVar34;
        if (uVar34 == 0) {
          pSVar31 = pSVar38 + 1;
          root.ptr = (size_t)(ulong)uVar130;
          if (uVar130 < uVar131) {
            (pSVar38->ptr).ptr = sVar14;
            pSVar38->dist = uVar131;
            pSVar38 = pSVar31;
          }
          else {
            (pSVar38->ptr).ptr = sVar40;
            pSVar38->dist = uVar130;
            pSVar38 = pSVar31;
            sVar40 = sVar14;
          }
        }
        else {
          auVar69._8_4_ = uVar130;
          auVar69._0_8_ = sVar40;
          auVar69._12_4_ = 0;
          auVar89._8_4_ = uVar131;
          auVar89._0_8_ = sVar14;
          auVar89._12_4_ = 0;
          lVar36 = 0;
          if (uVar34 != 0) {
            for (; (uVar34 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
            }
          }
          sVar40 = (&pSVar30->ptr)[lVar36].ptr;
          iVar13 = tNear.field_0.i[lVar36];
          auVar81._8_4_ = iVar13;
          auVar81._0_8_ = sVar40;
          auVar81._12_4_ = 0;
          auVar45._8_4_ = -(uint)((int)uVar130 < (int)uVar131);
          uVar34 = uVar34 - 1 & uVar34;
          if (uVar34 == 0) {
            auVar45._4_4_ = auVar45._8_4_;
            auVar45._0_4_ = auVar45._8_4_;
            auVar45._12_4_ = auVar45._8_4_;
            auVar92._8_4_ = uVar131;
            auVar92._0_8_ = sVar14;
            auVar92._12_4_ = 0;
            auVar93 = blendvps(auVar92,auVar69,auVar45);
            auVar68 = blendvps(auVar69,auVar89,auVar45);
            auVar46._8_4_ = -(uint)(auVar93._8_4_ < iVar13);
            auVar46._4_4_ = auVar46._8_4_;
            auVar46._0_4_ = auVar46._8_4_;
            auVar46._12_4_ = auVar46._8_4_;
            auVar90._8_4_ = iVar13;
            auVar90._0_8_ = sVar40;
            auVar90._12_4_ = 0;
            auVar80 = blendvps(auVar90,auVar93,auVar46);
            auVar93 = blendvps(auVar93,auVar81,auVar46);
            auVar47._8_4_ = -(uint)(auVar68._8_4_ < auVar93._8_4_);
            auVar47._4_4_ = auVar47._8_4_;
            auVar47._0_4_ = auVar47._8_4_;
            auVar47._12_4_ = auVar47._8_4_;
            SVar82 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar93,auVar68,auVar47);
            SVar70 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar68,auVar93,auVar47);
            *pSVar38 = SVar70;
            pSVar38[1] = SVar82;
            sVar40 = auVar80._0_8_;
            pSVar38 = pSVar38 + 2;
            pSVar31 = pSVar38;
            root.ptr = (size_t)(ulong)uVar34;
          }
          else {
            root.ptr = 0;
            if ((RayQueryContext *)(ulong)uVar34 != (RayQueryContext *)0x0) {
              for (; (uVar34 >> root.ptr & 1) == 0;
                  root.ptr = (long)&((RayQueryContext *)root.ptr)->scene + 1) {
              }
            }
            auVar48._4_4_ = auVar45._8_4_;
            auVar48._0_4_ = auVar45._8_4_;
            auVar48._8_4_ = auVar45._8_4_;
            auVar48._12_4_ = auVar45._8_4_;
            auVar94 = blendvps(auVar89,auVar69,auVar48);
            auVar68 = blendvps(auVar69,auVar89,auVar48);
            auVar97._8_4_ = tNear.field_0.i[root.ptr];
            auVar97._0_8_ = (&pSVar30->ptr)[root.ptr].ptr;
            auVar97._12_4_ = 0;
            auVar49._8_4_ = -(uint)(iVar13 < tNear.field_0.i[root.ptr]);
            auVar49._4_4_ = auVar49._8_4_;
            auVar49._0_4_ = auVar49._8_4_;
            auVar49._12_4_ = auVar49._8_4_;
            auVar93 = blendvps(auVar97,auVar81,auVar49);
            auVar80 = blendvps(auVar81,auVar97,auVar49);
            auVar50._8_4_ = -(uint)(auVar68._8_4_ < auVar80._8_4_);
            auVar50._4_4_ = auVar50._8_4_;
            auVar50._0_4_ = auVar50._8_4_;
            auVar50._12_4_ = auVar50._8_4_;
            auVar98 = blendvps(auVar80,auVar68,auVar50);
            SVar70 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar68,auVar80,auVar50);
            auVar51._8_4_ = -(uint)(auVar94._8_4_ < auVar93._8_4_);
            auVar51._4_4_ = auVar51._8_4_;
            auVar51._0_4_ = auVar51._8_4_;
            auVar51._12_4_ = auVar51._8_4_;
            auVar68 = blendvps(auVar93,auVar94,auVar51);
            auVar80 = blendvps(auVar94,auVar93,auVar51);
            auVar52._8_4_ = -(uint)(auVar80._8_4_ < auVar98._8_4_);
            auVar52._4_4_ = auVar52._8_4_;
            auVar52._0_4_ = auVar52._8_4_;
            auVar52._12_4_ = auVar52._8_4_;
            SVar82 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar98,auVar80,auVar52);
            SVar95 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar80,auVar98,auVar52);
            *pSVar38 = SVar70;
            pSVar38[1] = SVar95;
            pSVar38[2] = SVar82;
            sVar40 = auVar68._0_8_;
            pSVar38 = pSVar38 + 3;
            pSVar31 = pSVar38;
          }
        }
      }
    }
    lVar36 = (ulong)((uint)sVar40 & 0xf) - 8;
    uVar41 = sVar40 & 0xfffffffffffffff0;
    for (lVar37 = 0; lVar37 != lVar36; lVar37 = lVar37 + 1) {
      root.ptr = lVar37 * 0x140;
      fVar118 = *(float *)(ray + k * 4 + 0x70);
      pfVar5 = (float *)((long)&((RayQueryContext *)(root.ptr + 0x90))->scene + uVar41);
      pfVar4 = (float *)((long)&((RayQueryContext *)root.ptr)->scene + uVar41);
      fVar43 = *pfVar5 * fVar118 + *pfVar4;
      fVar56 = pfVar5[1] * fVar118 + pfVar4[1];
      fVar57 = pfVar5[2] * fVar118 + pfVar4[2];
      fVar58 = pfVar5[3] * fVar118 + pfVar4[3];
      pfVar5 = (float *)((long)&((RayQueryContext *)(root.ptr + 0x90))->args + uVar41);
      pfVar4 = (float *)((long)&((RayQueryContext *)root.ptr)->args + uVar41);
      fVar67 = *pfVar5 * fVar118 + *pfVar4;
      fVar76 = pfVar5[1] * fVar118 + pfVar4[1];
      fVar77 = pfVar5[2] * fVar118 + pfVar4[2];
      fVar78 = pfVar5[3] * fVar118 + pfVar4[3];
      pfVar5 = (float *)((long)&((RayQueryContext *)(root.ptr + 0xa8))->user + uVar41);
      pfVar4 = (float *)((long)&((RayQueryContext *)(root.ptr + 0x18))->user + uVar41);
      fVar79 = *pfVar5 * fVar118 + *pfVar4;
      fVar85 = pfVar5[1] * fVar118 + pfVar4[1];
      fVar86 = pfVar5[2] * fVar118 + pfVar4[2];
      fVar87 = pfVar5[3] * fVar118 + pfVar4[3];
      pfVar6 = (float *)((long)&((RayQueryContext *)(root.ptr + 0xc0))->scene + uVar41);
      pfVar4 = (float *)((long)&((RayQueryContext *)(root.ptr + 0x30))->scene + uVar41);
      pfVar7 = (float *)((long)&((RayQueryContext *)(root.ptr + 0xc0))->args + uVar41);
      pfVar5 = (float *)((long)&((RayQueryContext *)(root.ptr + 0x30))->args + uVar41);
      pfVar8 = (float *)((long)&((RayQueryContext *)(root.ptr + 0xd8))->user + uVar41);
      pfVar1 = (float *)((long)&((RayQueryContext *)(root.ptr + 0x48))->user + uVar41);
      pfVar9 = (float *)((long)&((RayQueryContext *)(root.ptr + 0xf0))->scene + uVar41);
      pfVar2 = (float *)((long)&((RayQueryContext *)(root.ptr + 0x60))->scene + uVar41);
      pfVar10 = (float *)((long)&((RayQueryContext *)(root.ptr + 0xf0))->args + uVar41);
      pfVar3 = (float *)((long)&((RayQueryContext *)(root.ptr + 0x60))->args + uVar41);
      pfVar11 = (float *)((long)&((RayQueryContext *)(root.ptr + 0x108))->user + uVar41);
      pfVar12 = (float *)((long)&((RayQueryContext *)(root.ptr + 0x78))->user + uVar41);
      fVar109 = fVar43 - (*pfVar6 * fVar118 + *pfVar4);
      fVar110 = fVar56 - (pfVar6[1] * fVar118 + pfVar4[1]);
      fVar111 = fVar57 - (pfVar6[2] * fVar118 + pfVar4[2]);
      fVar112 = fVar58 - (pfVar6[3] * fVar118 + pfVar4[3]);
      fVar117 = fVar67 - (*pfVar7 * fVar118 + *pfVar5);
      fVar120 = fVar76 - (pfVar7[1] * fVar118 + pfVar5[1]);
      fVar122 = fVar77 - (pfVar7[2] * fVar118 + pfVar5[2]);
      fVar124 = fVar78 - (pfVar7[3] * fVar118 + pfVar5[3]);
      fVar126 = fVar79 - (*pfVar8 * fVar118 + *pfVar1);
      fVar127 = fVar85 - (pfVar8[1] * fVar118 + pfVar1[1]);
      fVar128 = fVar86 - (pfVar8[2] * fVar118 + pfVar1[2]);
      fVar129 = fVar87 - (pfVar8[3] * fVar118 + pfVar1[3]);
      fVar59 = (*pfVar9 * fVar118 + *pfVar2) - fVar43;
      fVar64 = (pfVar9[1] * fVar118 + pfVar2[1]) - fVar56;
      fVar65 = (pfVar9[2] * fVar118 + pfVar2[2]) - fVar57;
      fVar66 = (pfVar9[3] * fVar118 + pfVar2[3]) - fVar58;
      fVar104 = (*pfVar10 * fVar118 + *pfVar3) - fVar67;
      fVar106 = (pfVar10[1] * fVar118 + pfVar3[1]) - fVar76;
      fVar107 = (pfVar10[2] * fVar118 + pfVar3[2]) - fVar77;
      fVar108 = (pfVar10[3] * fVar118 + pfVar3[3]) - fVar78;
      fVar96 = (fVar118 * *pfVar11 + *pfVar12) - fVar79;
      fVar100 = (fVar118 * pfVar11[1] + pfVar12[1]) - fVar85;
      fVar102 = (fVar118 * pfVar11[2] + pfVar12[2]) - fVar86;
      fVar103 = (fVar118 * pfVar11[3] + pfVar12[3]) - fVar87;
      local_10b8[0] = fVar126 * fVar104 - fVar117 * fVar96;
      local_10b8[1] = fVar127 * fVar106 - fVar120 * fVar100;
      local_10b8[2] = fVar128 * fVar107 - fVar122 * fVar102;
      local_10b8[3] = fVar129 * fVar108 - fVar124 * fVar103;
      fVar118 = *(float *)(ray + k * 4);
      fVar101 = *(float *)(ray + k * 4 + 0x10);
      fVar116 = *(float *)(ray + k * 4 + 0x40);
      fVar119 = *(float *)(ray + k * 4 + 0x50);
      fVar43 = fVar43 - fVar118;
      fVar56 = fVar56 - fVar118;
      fVar57 = fVar57 - fVar118;
      fVar58 = fVar58 - fVar118;
      fVar67 = fVar67 - fVar101;
      fVar76 = fVar76 - fVar101;
      fVar77 = fVar77 - fVar101;
      fVar78 = fVar78 - fVar101;
      fVar134 = fVar43 * fVar119 - fVar67 * fVar116;
      fVar135 = fVar56 * fVar119 - fVar76 * fVar116;
      fVar136 = fVar57 * fVar119 - fVar77 * fVar116;
      fVar137 = fVar58 * fVar119 - fVar78 * fVar116;
      local_10a8._0_4_ = fVar109 * fVar96 - fVar126 * fVar59;
      local_10a8._4_4_ = fVar110 * fVar100 - fVar127 * fVar64;
      local_10a8._8_4_ = fVar111 * fVar102 - fVar128 * fVar65;
      local_10a8._12_4_ = fVar112 * fVar103 - fVar129 * fVar66;
      fVar118 = *(float *)(ray + k * 4 + 0x20);
      fVar101 = *(float *)(ray + k * 4 + 0x60);
      fVar79 = fVar79 - fVar118;
      fVar85 = fVar85 - fVar118;
      fVar86 = fVar86 - fVar118;
      fVar87 = fVar87 - fVar118;
      fVar141 = fVar79 * fVar116 - fVar43 * fVar101;
      fVar142 = fVar85 * fVar116 - fVar56 * fVar101;
      fVar143 = fVar86 * fVar116 - fVar57 * fVar101;
      fVar144 = fVar87 * fVar116 - fVar58 * fVar101;
      local_1098[0] = fVar117 * fVar59 - fVar109 * fVar104;
      local_1098[1] = fVar120 * fVar64 - fVar110 * fVar106;
      local_1098[2] = fVar122 * fVar65 - fVar111 * fVar107;
      local_1098[3] = fVar124 * fVar66 - fVar112 * fVar108;
      fVar118 = fVar67 * fVar101 - fVar79 * fVar119;
      fVar121 = fVar76 * fVar101 - fVar85 * fVar119;
      fVar123 = fVar77 * fVar101 - fVar86 * fVar119;
      fVar125 = fVar78 * fVar101 - fVar87 * fVar119;
      fVar113 = fVar116 * local_10b8[0] + fVar119 * local_10a8._0_4_ + fVar101 * local_1098[0];
      fVar114 = fVar116 * local_10b8[1] + fVar119 * local_10a8._4_4_ + fVar101 * local_1098[1];
      fVar115 = fVar116 * local_10b8[2] + fVar119 * local_10a8._8_4_ + fVar101 * local_1098[2];
      fVar116 = fVar116 * local_10b8[3] + fVar119 * local_10a8._12_4_ + fVar101 * local_1098[3];
      uVar130 = (uint)fVar113 & 0x80000000;
      uVar131 = (uint)fVar114 & 0x80000000;
      uVar132 = (uint)fVar115 & 0x80000000;
      uVar133 = (uint)fVar116 & 0x80000000;
      tNear.field_0.i[0] = (uint)(fVar59 * fVar118 + fVar104 * fVar141 + fVar96 * fVar134) ^ uVar130
      ;
      tNear.field_0.i[1] =
           (uint)(fVar64 * fVar121 + fVar106 * fVar142 + fVar100 * fVar135) ^ uVar131;
      tNear.field_0.i[2] =
           (uint)(fVar65 * fVar123 + fVar107 * fVar143 + fVar102 * fVar136) ^ uVar132;
      tNear.field_0.i[3] =
           (uint)(fVar66 * fVar125 + fVar108 * fVar144 + fVar103 * fVar137) ^ uVar133;
      fVar119 = (float)((uint)(fVar118 * fVar109 + fVar141 * fVar117 + fVar134 * fVar126) ^ uVar130)
      ;
      fVar59 = (float)((uint)(fVar121 * fVar110 + fVar142 * fVar120 + fVar135 * fVar127) ^ uVar131);
      fVar64 = (float)((uint)(fVar123 * fVar111 + fVar143 * fVar122 + fVar136 * fVar128) ^ uVar132);
      fVar65 = (float)((uint)(fVar125 * fVar112 + fVar144 * fVar124 + fVar137 * fVar129) ^ uVar133);
      fVar118 = ABS(fVar113);
      fVar101 = ABS(fVar114);
      auVar99._0_8_ = CONCAT44(fVar114,fVar113) & 0x7fffffff7fffffff;
      auVar99._8_4_ = ABS(fVar115);
      auVar99._12_4_ = ABS(fVar116);
      bVar22 = ((0.0 <= fVar119 && 0.0 <= tNear.field_0.v[0]) && fVar113 != 0.0) &&
               tNear.field_0.v[0] + fVar119 <= fVar118;
      auVar105._0_4_ = -(uint)bVar22;
      bVar24 = ((0.0 <= fVar59 && 0.0 <= tNear.field_0.v[1]) && fVar114 != 0.0) &&
               tNear.field_0.v[1] + fVar59 <= fVar101;
      auVar105._4_4_ = -(uint)bVar24;
      bVar23 = ((0.0 <= fVar64 && 0.0 <= tNear.field_0.v[2]) && fVar115 != 0.0) &&
               tNear.field_0.v[2] + fVar64 <= auVar99._8_4_;
      auVar105._8_4_ = -(uint)bVar23;
      bVar21 = ((0.0 <= fVar65 && 0.0 <= tNear.field_0.v[3]) && fVar116 != 0.0) &&
               tNear.field_0.v[3] + fVar65 <= auVar99._12_4_;
      auVar105._12_4_ = -(uint)bVar21;
      uVar34 = movmskps((int)pSVar31,auVar105);
      pSVar31 = (StackItemT<embree::NodeRefPtr<4>_> *)(ulong)uVar34;
      if (uVar34 != 0) {
        fVar43 = (float)(uVar130 ^
                        (uint)(fVar43 * local_10b8[0] +
                              fVar67 * local_10a8._0_4_ + fVar79 * local_1098[0]));
        fVar56 = (float)(uVar131 ^
                        (uint)(fVar56 * local_10b8[1] +
                              fVar76 * local_10a8._4_4_ + fVar85 * local_1098[1]));
        fVar57 = (float)(uVar132 ^
                        (uint)(fVar57 * local_10b8[2] +
                              fVar77 * local_10a8._8_4_ + fVar86 * local_1098[2]));
        fVar58 = (float)(uVar133 ^
                        (uint)(fVar58 * local_10b8[3] +
                              fVar78 * local_10a8._12_4_ + fVar87 * local_1098[3]));
        fVar116 = *(float *)(ray + k * 4 + 0x30);
        bVar17 = fVar116 * fVar118 < fVar43;
        bVar18 = fVar116 * fVar101 < fVar56;
        bVar19 = fVar116 * auVar99._8_4_ < fVar57;
        bVar20 = fVar116 * auVar99._12_4_ < fVar58;
        auVar71._4_4_ = -(uint)bVar18;
        auVar71._0_4_ = -(uint)bVar17;
        auVar71._8_4_ = -(uint)bVar19;
        auVar71._12_4_ = -(uint)bVar20;
        local_11c8._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
        local_11c8._4_4_ = 0;
        local_11c8._8_4_ = 0;
        local_11c8._12_4_ = 0;
        valid.field_0.i[0] =
             -(uint)((fVar43 <= (float)local_11c8._0_4_ * fVar118 && bVar17) && bVar22);
        valid.field_0.i[1] =
             -(uint)((fVar56 <= (float)local_11c8._0_4_ * fVar101 && bVar18) && bVar24);
        valid.field_0.i[2] =
             -(uint)((fVar57 <= (float)local_11c8._0_4_ * auVar99._8_4_ && bVar19) && bVar23);
        valid.field_0.i[3] =
             -(uint)((fVar58 <= (float)local_11c8._0_4_ * auVar99._12_4_ && bVar20) && bVar21);
        uVar34 = movmskps(uVar34,(undefined1  [16])valid.field_0);
        pSVar31 = (StackItemT<embree::NodeRefPtr<4>_> *)(ulong)uVar34;
        if (uVar34 != 0) {
          local_1188 = context->scene;
          auVar72 = rcpps(auVar71,auVar99);
          fVar116 = auVar72._0_4_;
          fVar66 = auVar72._4_4_;
          fVar67 = auVar72._8_4_;
          fVar76 = auVar72._12_4_;
          fVar116 = (1.0 - fVar118 * fVar116) * fVar116 + fVar116;
          fVar66 = (1.0 - fVar101 * fVar66) * fVar66 + fVar66;
          fVar67 = (1.0 - auVar99._8_4_ * fVar67) * fVar67 + fVar67;
          fVar76 = (1.0 - auVar99._12_4_ * fVar76) * fVar76 + fVar76;
          fVar43 = fVar43 * fVar116;
          fVar56 = fVar56 * fVar66;
          fVar57 = fVar57 * fVar67;
          fVar58 = fVar58 * fVar76;
          local_10c8[0] = fVar43;
          local_10c8[1] = fVar56;
          local_10c8[2] = fVar57;
          local_10c8[3] = fVar58;
          local_10e8[0] = tNear.field_0.v[0] * fVar116;
          local_10e8[1] = tNear.field_0.v[1] * fVar66;
          local_10e8[2] = tNear.field_0.v[2] * fVar67;
          local_10e8[3] = tNear.field_0.v[3] * fVar76;
          local_10d8[0] = fVar116 * fVar119;
          local_10d8[1] = fVar66 * fVar59;
          local_10d8[2] = fVar67 * fVar64;
          local_10d8[3] = fVar76 * fVar65;
          auVar25._4_4_ = fVar56;
          auVar25._0_4_ = fVar43;
          auVar25._8_4_ = fVar57;
          auVar25._12_4_ = fVar58;
          auVar68 = blendvps(_DAT_01f45a30,auVar25,(undefined1  [16])valid.field_0);
          auVar83._4_4_ = auVar68._0_4_;
          auVar83._0_4_ = auVar68._4_4_;
          auVar83._8_4_ = auVar68._12_4_;
          auVar83._12_4_ = auVar68._8_4_;
          auVar72 = minps(auVar83,auVar68);
          auVar60._0_8_ = auVar72._8_8_;
          auVar60._8_4_ = auVar72._0_4_;
          auVar60._12_4_ = auVar72._4_4_;
          auVar72 = minps(auVar60,auVar72);
          uVar34 = -(uint)(auVar72._0_4_ == auVar68._0_4_);
          uVar130 = -(uint)(auVar72._4_4_ == auVar68._4_4_);
          uVar131 = -(uint)(auVar72._8_4_ == auVar68._8_4_);
          uVar132 = -(uint)(auVar72._12_4_ == auVar68._12_4_);
          auVar75._4_4_ = uVar130;
          auVar75._0_4_ = uVar34;
          auVar73._0_4_ = uVar34 & valid.field_0.i[0];
          auVar73._4_4_ = uVar130 & valid.field_0.i[1];
          auVar73._8_4_ = uVar131 & valid.field_0.i[2];
          auVar73._12_4_ = uVar132 & valid.field_0.i[3];
          iVar27 = movmskps((int)local_1188,auVar73);
          auVar74._8_4_ = 0xffffffff;
          auVar74._0_8_ = 0xffffffffffffffff;
          auVar74._12_4_ = 0xffffffff;
          if (iVar27 != 0) {
            auVar75._8_4_ = uVar131;
            auVar75._12_4_ = uVar132;
            auVar74 = auVar75;
          }
          root.ptr = (long)&((RayQueryContext *)root.ptr)->scene + uVar41;
          auVar53._0_4_ = valid.field_0.i[0] & auVar74._0_4_;
          auVar53._4_4_ = valid.field_0.i[1] & auVar74._4_4_;
          auVar53._8_4_ = valid.field_0.i[2] & auVar74._8_4_;
          auVar53._12_4_ = valid.field_0.i[3] & auVar74._12_4_;
          uVar28 = movmskps(iVar27,auVar53);
          uVar32 = CONCAT44((int)((ulong)local_1188 >> 0x20),uVar28);
          lVar33 = 0;
          if (uVar32 != 0) {
            for (; (uVar32 >> lVar33 & 1) == 0; lVar33 = lVar33 + 1) {
            }
          }
LAB_006f6944:
          uVar34 = *(uint *)((long)&((RayQueryContext *)(root.ptr + 0x120))->scene + lVar33 * 4);
          pGVar15 = (local_1188->geometries).items[uVar34].ptr;
          if ((pGVar15->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            *(undefined4 *)(local_11c8 + lVar33 * 4 + -0x10) = 0;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar15->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar118 = local_10e8[lVar33];
              fVar101 = local_10d8[lVar33];
              *(float *)(ray + k * 4 + 0x80) = local_10c8[lVar33];
              *(float *)(ray + k * 4 + 0xc0) = local_10b8[lVar33];
              *(float *)(ray + k * 4 + 0xd0) = local_1098[lVar33 + -4];
              *(float *)(ray + k * 4 + 0xe0) = local_1098[lVar33];
              *(float *)(ray + k * 4 + 0xf0) = fVar118;
              *(float *)(ray + k * 4 + 0x100) = fVar101;
              *(undefined4 *)(ray + k * 4 + 0x110) =
                   *(undefined4 *)
                    ((long)&((RayQueryContext *)(root.ptr + 0x120))->args + lVar33 * 4);
              *(uint *)(ray + k * 4 + 0x120) = uVar34;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              uVar34 = context->user->instPrimID[0];
              pSVar31 = (StackItemT<embree::NodeRefPtr<4>_> *)(ulong)uVar34;
              *(uint *)(ray + k * 4 + 0x140) = uVar34;
              root.ptr = (size_t)context;
              goto LAB_006f67c5;
            }
            local_1088 = fVar43;
            fStack_1084 = fVar56;
            fStack_1080 = fVar57;
            fStack_107c = fVar58;
            h.u.field_0.v[0] = local_10e8[lVar33];
            h.v.field_0.v[0] = local_10d8[lVar33];
            fVar118 = local_10b8[lVar33];
            fVar101 = local_1098[lVar33 + -4];
            h.geomID.field_0.i[1] = uVar34;
            h.geomID.field_0.i[0] = uVar34;
            h.geomID.field_0.i[2] = uVar34;
            h.geomID.field_0.i[3] = uVar34;
            uVar28 = *(undefined4 *)
                      ((long)&((RayQueryContext *)(root.ptr + 0x120))->args + lVar33 * 4);
            h.primID.field_0.i[1] = uVar28;
            h.primID.field_0.i[0] = uVar28;
            h.primID.field_0.i[2] = uVar28;
            h.primID.field_0.i[3] = uVar28;
            h.Ng.field_0._4_4_ = (int)fVar118;
            h.Ng.field_0._0_4_ = (int)fVar118;
            h.Ng.field_0._8_4_ = (int)fVar118;
            h.Ng.field_0._12_4_ = (int)fVar118;
            h.Ng.field_0._20_4_ = (int)fVar101;
            h.Ng.field_0._16_4_ = (int)fVar101;
            h.Ng.field_0._24_4_ = (int)fVar101;
            h.Ng.field_0._28_4_ = (int)fVar101;
            fVar118 = local_1098[lVar33];
            h.Ng.field_0._36_4_ = (int)fVar118;
            h.Ng.field_0._32_4_ = (int)fVar118;
            h.Ng.field_0._40_4_ = (int)fVar118;
            h.Ng.field_0._44_4_ = (int)fVar118;
            h.u.field_0.v[1] = h.u.field_0.v[0];
            h.u.field_0.v[2] = h.u.field_0.v[0];
            h.u.field_0.v[3] = h.u.field_0.v[0];
            h.v.field_0.v[1] = h.v.field_0.v[0];
            h.v.field_0.v[2] = h.v.field_0.v[0];
            h.v.field_0.v[3] = h.v.field_0.v[0];
            h.instID[0].field_0.i[0] = context->user->instID[0];
            h.instID[0].field_0.i[1] = h.instID[0].field_0.i[0];
            h.instID[0].field_0.i[2] = h.instID[0].field_0.i[0];
            h.instID[0].field_0.i[3] = h.instID[0].field_0.i[0];
            h.instPrimID[0].field_0.i[0] = context->user->instPrimID[0];
            h.instPrimID[0].field_0.i[1] = h.instPrimID[0].field_0.i[0];
            h.instPrimID[0].field_0.i[2] = h.instPrimID[0].field_0.i[0];
            h.instPrimID[0].field_0.i[3] = h.instPrimID[0].field_0.i[0];
            *(float *)(ray + k * 4 + 0x80) = local_10c8[lVar33];
            local_11b8 = *local_1180;
            args.valid = (int *)&local_11b8;
            args.geometryUserPtr = pGVar15->userPtr;
            args.context = context->user;
            args.hit = (RTCHitN *)&h;
            args.N = 4;
            local_11a0 = lVar37;
            local_1198 = lVar36;
            local_1190 = pSVar38;
            args.ray = (RTCRayN *)ray;
            if (pGVar15->intersectionFilterN != (RTCFilterFunctionN)0x0) {
              (*pGVar15->intersectionFilterN)(&args);
            }
            if (local_11b8 == (StackItemT<embree::NodeRefPtr<4>_>)0x0) {
              auVar61._8_4_ = 0xffffffff;
              auVar61._0_8_ = 0xffffffffffffffff;
              auVar61._12_4_ = 0xffffffff;
              auVar61 = auVar61 ^ _DAT_01f46b70;
            }
            else {
              p_Var16 = context->args->filter;
              if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar15->field_8).field_0x2 & 0x40) != 0))))
              {
                (*p_Var16)(&args);
              }
              auVar54._0_4_ = -(uint)((int)local_11b8.ptr.ptr == 0);
              auVar54._4_4_ = -(uint)(local_11b8.ptr.ptr._4_4_ == 0);
              auVar54._8_4_ = -(uint)(local_11b8.dist == 0);
              auVar54._12_4_ = -(uint)(local_11b8._12_4_ == 0);
              auVar61 = auVar54 ^ _DAT_01f46b70;
              if (local_11b8 != (StackItemT<embree::NodeRefPtr<4>_>)0x0) {
                auVar72 = blendvps(*(undefined1 (*) [16])args.hit,
                                   *(undefined1 (*) [16])(args.ray + 0xc0),auVar54);
                *(undefined1 (*) [16])(args.ray + 0xc0) = auVar72;
                auVar72 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                   *(undefined1 (*) [16])(args.ray + 0xd0),auVar54);
                *(undefined1 (*) [16])(args.ray + 0xd0) = auVar72;
                auVar72 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                   *(undefined1 (*) [16])(args.ray + 0xe0),auVar54);
                *(undefined1 (*) [16])(args.ray + 0xe0) = auVar72;
                auVar72 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                   *(undefined1 (*) [16])(args.ray + 0xf0),auVar54);
                *(undefined1 (*) [16])(args.ray + 0xf0) = auVar72;
                auVar72 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                   *(undefined1 (*) [16])(args.ray + 0x100),auVar54);
                *(undefined1 (*) [16])(args.ray + 0x100) = auVar72;
                auVar72 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                   *(undefined1 (*) [16])(args.ray + 0x110),auVar54);
                *(undefined1 (*) [16])(args.ray + 0x110) = auVar72;
                auVar72 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                   *(undefined1 (*) [16])(args.ray + 0x120),auVar54);
                *(undefined1 (*) [16])(args.ray + 0x120) = auVar72;
                auVar72 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                   *(undefined1 (*) [16])(args.ray + 0x130),auVar54);
                *(undefined1 (*) [16])(args.ray + 0x130) = auVar72;
                auVar72 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                   *(undefined1 (*) [16])(args.ray + 0x140),auVar54);
                *(undefined1 (*) [16])(args.ray + 0x140) = auVar72;
              }
            }
            if ((_DAT_01f46b40 & auVar61) == (undefined1  [16])0x0) {
              *(undefined4 *)(ray + k * 4 + 0x80) = local_11c8._0_4_;
            }
            else {
              local_11c8 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
            }
            *(undefined4 *)(local_11c8 + lVar33 * 4 + -0x10) = 0;
            valid.field_0.i[0] = -(uint)(local_1088 <= (float)local_11c8._0_4_) & valid.field_0.i[0]
            ;
            valid.field_0.i[1] =
                 -(uint)(fStack_1084 <= (float)local_11c8._0_4_) & valid.field_0.i[1];
            valid.field_0.i[2] =
                 -(uint)(fStack_1080 <= (float)local_11c8._0_4_) & valid.field_0.i[2];
            valid.field_0.i[3] =
                 -(uint)(fStack_107c <= (float)local_11c8._0_4_) & valid.field_0.i[3];
            lVar36 = local_1198;
            lVar37 = local_11a0;
            pSVar38 = local_1190;
            fVar43 = local_1088;
            fVar56 = fStack_1084;
            fVar57 = fStack_1080;
            fVar58 = fStack_107c;
          }
          uVar28 = (undefined4)((ulong)lVar33 >> 0x20);
          iVar27 = movmskps((int)lVar33,(undefined1  [16])valid.field_0);
          pSVar31 = (StackItemT<embree::NodeRefPtr<4>_> *)CONCAT44(uVar28,iVar27);
          if (iVar27 == 0) goto LAB_006f67c5;
          auVar26._4_4_ = fVar56;
          auVar26._0_4_ = fVar43;
          auVar26._8_4_ = fVar57;
          auVar26._12_4_ = fVar58;
          auVar68 = blendvps(_DAT_01f45a30,auVar26,(undefined1  [16])valid.field_0);
          auVar84._4_4_ = auVar68._0_4_;
          auVar84._0_4_ = auVar68._4_4_;
          auVar84._8_4_ = auVar68._12_4_;
          auVar84._12_4_ = auVar68._8_4_;
          auVar72 = minps(auVar84,auVar68);
          auVar62._0_8_ = auVar72._8_8_;
          auVar62._8_4_ = auVar72._0_4_;
          auVar62._12_4_ = auVar72._4_4_;
          auVar72 = minps(auVar62,auVar72);
          auVar63._0_8_ =
               CONCAT44(-(uint)(auVar72._4_4_ == auVar68._4_4_) & valid.field_0._4_4_,
                        -(uint)(auVar72._0_4_ == auVar68._0_4_) & valid.field_0._0_4_);
          auVar63._8_4_ = -(uint)(auVar72._8_4_ == auVar68._8_4_) & valid.field_0._8_4_;
          auVar63._12_4_ = -(uint)(auVar72._12_4_ == auVar68._12_4_) & valid.field_0._12_4_;
          iVar27 = movmskps(iVar27,auVar63);
          aVar55 = valid.field_0;
          if (iVar27 != 0) {
            aVar55.i[2] = auVar63._8_4_;
            aVar55._0_8_ = auVar63._0_8_;
            aVar55.i[3] = auVar63._12_4_;
          }
          uVar29 = movmskps(iVar27,(undefined1  [16])aVar55);
          uVar32 = CONCAT44(uVar28,uVar29);
          lVar33 = 0;
          if (uVar32 != 0) {
            for (; (uVar32 >> lVar33 & 1) == 0; lVar33 = lVar33 + 1) {
            }
          }
          goto LAB_006f6944;
        }
      }
LAB_006f67c5:
      fVar118 = local_1018;
      fVar57 = fStack_1014;
      fVar58 = fStack_1010;
      fVar59 = fStack_100c;
      fVar101 = local_1028;
      fVar64 = fStack_1024;
      fVar65 = fStack_1020;
      fVar66 = fStack_101c;
      fVar116 = local_1038;
      fVar67 = fStack_1034;
      fVar76 = fStack_1030;
      fVar77 = fStack_102c;
      fVar119 = local_1048;
      fVar78 = fStack_1044;
      fVar79 = fStack_1040;
      fVar85 = fStack_103c;
      fVar43 = local_1058;
      fVar86 = fStack_1054;
      fVar87 = fStack_1050;
      fVar96 = fStack_104c;
      fVar56 = local_1068;
      fVar100 = fStack_1064;
      fVar102 = fStack_1060;
      fVar103 = fStack_105c;
      iVar27 = local_1078;
      iVar138 = iStack_1074;
      iVar139 = iStack_1070;
      iVar140 = iStack_106c;
    }
    uVar28 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar72._4_4_ = uVar28;
    auVar72._0_4_ = uVar28;
    auVar72._8_4_ = uVar28;
    auVar72._12_4_ = uVar28;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }